

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::NamespaceOpener::ChangeTo
          (NamespaceOpener *this,size_t param_2,char *param_3)

{
  Printer *pPVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  string_view s;
  undefined1 auVar2 [8];
  bool bVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  reference __rhs;
  size_type sVar6;
  Sub *local_3b0;
  Sub *local_358;
  basic_string_view<char,_std::char_traits<char>_> local_318;
  undefined1 local_302;
  allocator<char> local_301;
  string local_300;
  Sub *local_2e0;
  Sub local_2d8;
  iterator local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_210;
  undefined1 local_200 [8];
  size_t i_1;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  undefined1 local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  Sub *local_1b8;
  Sub local_1b0;
  iterator local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e8;
  undefined1 local_d8 [8];
  size_t i;
  size_t common_idx;
  unsigned_long local_c0;
  ulong local_b8;
  size_t len;
  undefined8 local_98;
  char *pcStack_90;
  undefined1 local_88 [72];
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_stack;
  NamespaceOpener *this_local;
  string_view name_local;
  
  s._M_str = param_3;
  s._M_len = param_2;
  local_98 = param_2;
  pcStack_90 = param_3;
  new_stack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            ((ConvertibleToStringView *)local_88,s);
  absl::lts_20250127::StrSplit<char_const*,absl::lts_20250127::SkipEmpty>
            ((Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)(local_88 + 0x10),(lts_20250127 *)local_88._0_8_,local_88._8_8_,"::");
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,
             (Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)(local_88 + 0x10));
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~Splitter((Splitter<absl::lts_20250127::ByString,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *)(local_88 + 0x10));
  local_c0 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->name_stack_);
  common_idx = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_40);
  puVar4 = std::min<unsigned_long>(&local_c0,&common_idx);
  local_b8 = *puVar4;
  for (i = 0; i < local_b8; i = i + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->name_stack_,i);
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,i);
    bVar3 = std::operator!=(pvVar5,__rhs);
    if (bVar3) break;
  }
  for (local_d8 = (undefined1  [8])
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->name_stack_); i < (ulong)local_d8;
      local_d8 = (undefined1  [8])((long)local_d8 - 1)) {
    pPVar1 = this->p_;
    local_1da = 1;
    local_1b8 = &local_1b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"ns",&local_1d9);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->name_stack_,(long)local_d8 - 1);
    protobuf::io::Printer::Sub::Sub<std::__cxx11::string&>(&local_1b0,&local_1d8,pvVar5);
    local_1da = 0;
    local_f8 = &local_1b0;
    local_f0 = 1;
    v_00._M_len = 1;
    v_00._M_array = local_f8;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_e8._M_local_buf,v_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,"\n      }  // namespace $ns$\n    ");
    protobuf::io::Printer::Emit
              (pPVar1,local_e8._M_allocated_capacity,local_e8._8_8_,local_1f0._M_len,
               local_1f0._M_str);
    local_358 = (Sub *)&local_f8;
    do {
      local_358 = local_358 + -1;
      protobuf::io::Printer::Sub::~Sub(local_358);
    } while (local_358 != &local_1b0);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  for (local_200 = (undefined1  [8])i; auVar2 = local_200,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), (ulong)auVar2 < sVar6;
      local_200 = (undefined1  [8])((long)local_200 + 1)) {
    pPVar1 = this->p_;
    local_302 = 1;
    local_2e0 = &local_2d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"ns",&local_301);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,(size_type)local_200);
    protobuf::io::Printer::Sub::Sub<std::__cxx11::string&>(&local_2d8,&local_300,pvVar5);
    local_302 = 0;
    local_220 = &local_2d8;
    local_218 = 1;
    v._M_len = 1;
    v._M_array = local_220;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_210._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_318,"\n      namespace $ns$ {\n    ");
    protobuf::io::Printer::Emit
              (pPVar1,local_210._M_allocated_capacity,local_210._8_8_,local_318._M_len,
               local_318._M_str);
    local_3b0 = (Sub *)&local_220;
    do {
      local_3b0 = local_3b0 + -1;
      protobuf::io::Printer::Sub::~Sub(local_3b0);
    } while (local_3b0 != &local_2d8);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->name_stack_,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void NamespaceOpener::ChangeTo(absl::string_view name,
                               io::Printer::SourceLocation loc) {
  std::vector<std::string> new_stack =
      absl::StrSplit(name, "::", absl::SkipEmpty());
  size_t len = std::min(name_stack_.size(), new_stack.size());
  size_t common_idx = 0;
  while (common_idx < len) {
    if (name_stack_[common_idx] != new_stack[common_idx]) {
      break;
    }
    ++common_idx;
  }

  for (size_t i = name_stack_.size(); i > common_idx; i--) {
    p_->Emit({{"ns", name_stack_[i - 1]}}, R"(
      }  // namespace $ns$
    )",
             loc);
  }
  for (size_t i = common_idx; i < new_stack.size(); ++i) {
    p_->Emit({{"ns", new_stack[i]}}, R"(
      namespace $ns$ {
    )",
             loc);
  }

  name_stack_ = std::move(new_stack);
}